

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

void __thiscall
KMaxDistance::edgeCosts
          (KMaxDistance *this,double *image,int width,int height,double brSigma,double sxy,
          double *xCosts,double *yCosts)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int idx_1;
  int x_1;
  int y_1;
  int idx;
  int x;
  int y;
  double *yCosts_local;
  double *xCosts_local;
  double sxy_local;
  double brSigma_local;
  int height_local;
  int width_local;
  double *image_local;
  KMaxDistance *this_local;
  
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width + -1; x = x + 1) {
      iVar1 = y * width + x;
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = image[iVar1] - image[iVar1 + 1];
      auVar3 = vpand_avx(auVar2,auVar4);
      xCosts[iVar1] = auVar3._0_8_ + sxy;
    }
  }
  for (y_1 = 0; y_1 < height + -1; y_1 = y_1 + 1) {
    for (x_1 = 0; x_1 < width; x_1 = x_1 + 1) {
      iVar1 = y_1 * width + x_1;
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = image[iVar1] - image[iVar1 + width];
      auVar3 = vpand_avx(auVar3,auVar5);
      yCosts[iVar1] = auVar3._0_8_ + sxy;
    }
  }
  return;
}

Assistant:

void KMaxDistance::edgeCosts( const double *image, const int width, const int height,
    const double brSigma, const double sxy, double *xCosts, double *yCosts ){
    
    //double sxy2 = sxy*sxy;
    for ( int y = 0; y < height; ++y ){
        for ( int x = 0; x < width-1; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+1], brSigma );
            //xCosts[idx] = sqrt( sxy2 + dbr*dbr );
            xCosts[idx] = fabs(image[idx] - image[idx+1]) + sxy;
        }
    }
    for ( int y = 0; y < height-1; ++y ){
        for ( int x = 0; x < width; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+width], brSigma );
            //yCosts[idx] = sqrt( sxy2 + dbr*dbr );
            yCosts[idx] = fabs(image[idx] - image[idx+width]) + sxy;
        }
    }
}